

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O0

int ldelnewline(void)

{
  line *__ptr;
  line *__ptr_00;
  line *plVar1;
  mgwin *pmStack_30;
  int s;
  mgwin *wp;
  line *lp3;
  line *lp2;
  line *lp1;
  
  lp1._4_4_ = checkdirty(curbp);
  if (lp1._4_4_ == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      __ptr = curwp->w_dotp;
      __ptr_00 = __ptr->l_fp;
      if (__ptr_00 == curbp->b_headp) {
        lp1._4_4_ = 1;
      }
      else {
        curwp->w_bufp->b_lines = curwp->w_bufp->b_lines + -1;
        if (curwp->w_dotline < curwp->w_markline) {
          curwp->w_markline = curwp->w_markline + -1;
        }
        if (__ptr->l_size - __ptr->l_used < __ptr_00->l_used) {
          plVar1 = lalloc(__ptr->l_used + __ptr_00->l_used);
          if (plVar1 == (line *)0x0) {
            lp1._4_4_ = 0;
          }
          else {
            memmove(plVar1->l_text,__ptr->l_text,(long)__ptr->l_used);
            memmove(plVar1->l_text + __ptr->l_used,__ptr_00->l_text,(long)__ptr_00->l_used);
            __ptr->l_bp->l_fp = plVar1;
            plVar1->l_fp = __ptr_00->l_fp;
            __ptr_00->l_fp->l_bp = plVar1;
            plVar1->l_bp = __ptr->l_bp;
            for (pmStack_30 = wheadp; pmStack_30 != (mgwin *)0x0;
                pmStack_30 = (pmStack_30->w_list).l_p.l_wp) {
              if ((pmStack_30->w_linep == __ptr) || (pmStack_30->w_linep == __ptr_00)) {
                pmStack_30->w_linep = plVar1;
              }
              if (pmStack_30->w_dotp == __ptr) {
                pmStack_30->w_dotp = plVar1;
              }
              else if (pmStack_30->w_dotp == __ptr_00) {
                pmStack_30->w_dotp = plVar1;
                pmStack_30->w_doto = __ptr->l_used + pmStack_30->w_doto;
              }
              if (pmStack_30->w_markp == __ptr) {
                pmStack_30->w_markp = plVar1;
              }
              else if (pmStack_30->w_markp == __ptr_00) {
                pmStack_30->w_markp = plVar1;
                pmStack_30->w_marko = __ptr->l_used + pmStack_30->w_marko;
              }
            }
            free(__ptr);
            free(__ptr_00);
            lp1._4_4_ = 1;
          }
        }
        else {
          memmove(__ptr->l_text + __ptr->l_used,__ptr_00->l_text,(long)__ptr_00->l_used);
          for (pmStack_30 = wheadp; pmStack_30 != (mgwin *)0x0;
              pmStack_30 = (pmStack_30->w_list).l_p.l_wp) {
            if (pmStack_30->w_linep == __ptr_00) {
              pmStack_30->w_linep = __ptr;
            }
            if (pmStack_30->w_dotp == __ptr_00) {
              pmStack_30->w_dotp = __ptr;
              pmStack_30->w_doto = __ptr->l_used + pmStack_30->w_doto;
            }
            if (pmStack_30->w_markp == __ptr_00) {
              pmStack_30->w_markp = __ptr;
              pmStack_30->w_marko = __ptr->l_used + pmStack_30->w_marko;
            }
          }
          __ptr->l_used = __ptr_00->l_used + __ptr->l_used;
          __ptr->l_fp = __ptr_00->l_fp;
          __ptr_00->l_fp->l_bp = __ptr;
          free(__ptr_00);
          lp1._4_4_ = 1;
        }
      }
    }
    else {
      dobeep();
      ewprintf("Buffer is read only");
      lp1._4_4_ = 0;
    }
  }
  return lp1._4_4_;
}

Assistant:

int
ldelnewline(void)
{
	struct line	*lp1, *lp2, *lp3;
	struct mgwin	*wp;
	int s;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read only");
		return (FALSE);
	}

	lp1 = curwp->w_dotp;
	lp2 = lp1->l_fp;
	/* at the end of the buffer */
	if (lp2 == curbp->b_headp)
		return (TRUE);
	/* Keep line counts in sync */
	curwp->w_bufp->b_lines--;
	if (curwp->w_markline > curwp->w_dotline)
		curwp->w_markline--;
	if (lp2->l_used <= lp1->l_size - lp1->l_used) {
		bcopy(&lp2->l_text[0], &lp1->l_text[lp1->l_used], lp2->l_used);
		for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
			if (wp->w_linep == lp2)
				wp->w_linep = lp1;
			if (wp->w_dotp == lp2) {
				wp->w_dotp = lp1;
				wp->w_doto += lp1->l_used;
			}
			if (wp->w_markp == lp2) {
				wp->w_markp = lp1;
				wp->w_marko += lp1->l_used;
			}
		}
		lp1->l_used += lp2->l_used;
		lp1->l_fp = lp2->l_fp;
		lp2->l_fp->l_bp = lp1;
		free(lp2);
		return (TRUE);
	}
	if ((lp3 = lalloc(lp1->l_used + lp2->l_used)) == NULL)
		return (FALSE);
	bcopy(&lp1->l_text[0], &lp3->l_text[0], lp1->l_used);
	bcopy(&lp2->l_text[0], &lp3->l_text[lp1->l_used], lp2->l_used);
	lp1->l_bp->l_fp = lp3;
	lp3->l_fp = lp2->l_fp;
	lp2->l_fp->l_bp = lp3;
	lp3->l_bp = lp1->l_bp;
	for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
		if (wp->w_linep == lp1 || wp->w_linep == lp2)
			wp->w_linep = lp3;
		if (wp->w_dotp == lp1)
			wp->w_dotp = lp3;
		else if (wp->w_dotp == lp2) {
			wp->w_dotp = lp3;
			wp->w_doto += lp1->l_used;
		}
		if (wp->w_markp == lp1)
			wp->w_markp = lp3;
		else if (wp->w_markp == lp2) {
			wp->w_markp = lp3;
			wp->w_marko += lp1->l_used;
		}
	}
	free(lp1);
	free(lp2);
	return (TRUE);
}